

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall ConfigTest_rewrite_Test::TestBody(ConfigTest_rewrite_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  undefined1 local_1b8 [64];
  AssertionResult gtest_ar;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_168;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_148;
  path local_128;
  path file_path;
  config l_config;
  
  jessilib::config::config(&l_config);
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_128,(char (*) [13])"rewrite.test",auto_format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"some_data",(allocator<char> *)&local_168);
  make_tmp_file(&file_path,&local_128,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::filesystem::__cxx11::path::~path(&local_128);
  local_1b8._0_8_ = local_1b8 + 0x10;
  local_1b8._8_8_ = 0;
  local_1b8[0x10] = '\0';
  jessilib::config::load((path *)&l_config,(string *)&file_path,(text_encoding)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  jessilib::object::object((object *)local_1b8,(uchar *)"some_other_data");
  jessilib::config::set_data((object *)&l_config);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_1b8);
  jessilib::config::write();
  jessilib::config::reload();
  jessilib::config::data();
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_168,(object *)local_1b8,&local_148);
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[16]>
            ((internal *)&gtest_ar,"l_config.data().get<std::u8string>()","u8\"some_other_data\"",
             &local_168,(char8_t (*) [16])"some_other_data");
  std::__cxx11::u8string::~u8string((u8string *)&local_168);
  std::__cxx11::u8string::~u8string((u8string *)&local_148);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_1b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x87,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((void *)local_1b8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_1b8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::filesystem::__cxx11::path::~path(&file_path);
  jessilib::config::~config(&l_config);
  return;
}

Assistant:

TEST(ConfigTest, rewrite) {
	config l_config;

	// Write temp file out
	std::filesystem::path file_path = make_tmp_file("rewrite.test", "some_data");

	// Load data from disk
	l_config.load(file_path);

	// Set some other data
	l_config.set_data(u8"some_other_data");

	// Write data to disk
	l_config.write();

	// Reload from disk and verify
	l_config.reload();
	EXPECT_EQ(l_config.data().get<std::u8string>(), u8"some_other_data");
}